

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

void __thiscall Matrix::Matrix(Matrix *this)

{
  int *piVar1;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0015c778;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  (this->sMatrixName)._M_dataplus._M_p = (pointer)&(this->sMatrixName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sMatrixName,"data","");
  this->nMatrixDimension = 0;
  piVar1 = (int *)operator_new__(4);
  this->pSize = piVar1;
  *piVar1 = 1;
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  *this->pData = 0.0;
  return;
}

Assistant:

Matrix::Matrix() : sMatrixName("data") 
{ 
	nMatrixDimension = 0;
	pSize = new int[1];
	pSize[0] = 1;
	bReference = false;
	init();
	pData[0] = 0.0;
}